

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

int __thiscall ADPlanner::ReconstructPath(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  SBPL_Exception *this_00;
  long in_RSI;
  long in_RDI;
  int max_steps;
  int steps;
  ADState *stateinfo;
  ADState *predstateinfo;
  CMDPSTATE *PredMDPstate;
  CMDPSTATE *MDPstate;
  char *in_stack_ffffffffffffff98;
  SBPL_Exception *in_stack_ffffffffffffffa0;
  int local_3c;
  long local_20;
  
  if ((*(byte *)(in_RDI + 0x70) & 1) != 0) {
    local_3c = 0;
    local_20 = *(long *)(in_RSI + 0x28);
    while (local_20 != *(long *)(in_RSI + 0x30) && local_3c < 100000) {
      local_3c = local_3c + 1;
      lVar1 = *(long *)(local_20 + 0x38);
      if (*(int *)(lVar1 + 0x24) == 1000000000) {
        return -1;
      }
      if (*(long *)(lVar1 + 0x30) == 0) {
        uVar4 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      lVar2 = *(long *)(lVar1 + 0x30);
      lVar3 = *(long *)(lVar2 + 0x38);
      *(long *)(lVar3 + 0x38) = local_20;
      local_20 = lVar2;
      if (*(uint *)(lVar1 + 0x24) <= *(uint *)(lVar3 + 0x20)) {
        this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(this_00,in_stack_ffffffffffffff98);
        __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
    }
    if (local_20 != *(long *)(in_RSI + 0x30)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int ADPlanner::ReconstructPath(ADSearchStateSpace_t* pSearchStateSpace)
{
    //nothing to do, if search is backward
    if (bforwardsearch) {
        CMDPSTATE* MDPstate = pSearchStateSpace->searchgoalstate;
        CMDPSTATE* PredMDPstate;
        ADState *predstateinfo, *stateinfo;

        int steps = 0;
        const int max_steps = 100000;
        while (MDPstate != pSearchStateSpace->searchstartstate && steps < max_steps) {
            steps++;

            stateinfo = (ADState*)MDPstate->PlannerSpecificData;

            if (stateinfo->g == INFINITECOST) {
                //throw SBPL_Exception("ERROR in ReconstructPath: g of the state on the path is INFINITE");
                return -1;
            }

            if (stateinfo->bestpredstate == NULL) {
                throw SBPL_Exception("ERROR in ReconstructPath: bestpred is NULL");
            }

            //get the parent state
            PredMDPstate = stateinfo->bestpredstate;
            predstateinfo = (ADState*)PredMDPstate->PlannerSpecificData;

            //set its best next info
            predstateinfo->bestnextstate = MDPstate;

            //check the decrease of g-values along the path
            if (predstateinfo->v >= stateinfo->g) {
                throw SBPL_Exception("ERROR in ReconstructPath: g-values are non-decreasing");
            }

            //transition back
            MDPstate = PredMDPstate;
        }

        if (MDPstate != pSearchStateSpace->searchstartstate) {
            SBPL_ERROR("ERROR: Failed to reconstruct path (compute bestnextstate pointers): steps processed=%d\n",
                       steps);
            return 0;
        }
    }

    return 1;
}